

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O0

QCborValue * __thiscall QJsonPrivate::Parser::parse(Parser *this,QJsonParseError *error)

{
  bool bVar1;
  int *in_RDX;
  QCborContainerPrivate *in_RSI;
  Parser *in_RDI;
  long in_FS_OFFSET;
  char token;
  QCborValue value;
  QCborContainerPrivate *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  ContainerDisposition in_stack_ffffffffffffff34;
  QCborContainerPrivate *in_stack_ffffffffffffff38;
  qint64 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff4c;
  Type type;
  QCborValue *in_stack_ffffffffffffff50;
  Parser *this_00;
  undefined7 in_stack_ffffffffffffff88;
  char cVar2;
  QCborValue local_58 [2];
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  eatBOM((Parser *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  ::QCborValue::QCborValue((QCborValue *)&local_28);
  bVar1 = eatSpace((Parser *)in_RSI);
  if (bVar1) {
    cVar2 = *(char *)in_RSI->usedData;
    if (cVar2 == '\"') {
      in_stack_ffffffffffffff50 = (QCborValue *)operator_new(0x40);
      QCborContainerPrivate::QCborContainerPrivate
                ((QCborContainerPrivate *)
                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      QExplicitlySharedDataPointer<QCborContainerPrivate>::operator=
                ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)
                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28);
      in_RSI->usedData = (size_type)((char *)in_RSI->usedData + 1);
      bVar1 = parseString((Parser *)CONCAT17(cVar2,in_stack_ffffffffffffff88));
      type = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff4c);
      if (bVar1) {
        QExplicitlySharedDataPointer<QCborContainerPrivate>::take
                  ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)in_stack_ffffffffffffff38)
        ;
        QCborContainerPrivate::makeValue
                  (type,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                   in_stack_ffffffffffffff34);
        ::QCborValue::operator=
                  ((QCborValue *)in_stack_ffffffffffffff38,
                   (QCborValue *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
        ::QCborValue::~QCborValue
                  ((QCborValue *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
LAB_0049689c:
        eatSpace((Parser *)in_RSI);
        if ((in_RSI->data).d.d <= (Data *)in_RSI->usedData) {
          if (in_RDX != (int *)0x0) {
            *in_RDX = 0;
            in_RDX[1] = 0;
          }
          ::QCborValue::QCborValue((QCborValue *)in_RDI,in_stack_ffffffffffffff50);
          goto LAB_00496951;
        }
        *(ParseError *)((long)&(in_RSI->data).d.ptr + 4) = GarbageAtEnd;
      }
    }
    else {
      parseValue(this_00);
      ::QCborValue::operator=
                (local_58,(QCborValue *)
                          CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      ::QCborValue::~QCborValue
                ((QCborValue *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      bVar1 = ::QCborValue::isUndefined((QCborValue *)0x496888);
      if (!bVar1) goto LAB_0049689c;
    }
  }
  else {
    *(ParseError *)((long)&(in_RSI->data).d.ptr + 4) = IllegalValue;
  }
  QExplicitlySharedDataPointer<QCborContainerPrivate>::reset
            ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)in_stack_ffffffffffffff50,in_RSI
            );
  if (in_RDX != (int *)0x0) {
    *in_RDX = (int)in_RSI->usedData - (int)*(undefined8 *)in_RSI;
    in_RDX[1] = *(int *)((long)&(in_RSI->data).d.ptr + 4);
  }
  ::QCborValue::QCborValue((QCborValue *)in_RDI);
LAB_00496951:
  ::QCborValue::~QCborValue
            ((QCborValue *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QCborValue *)this_00;
}

Assistant:

QCborValue Parser::parse(QJsonParseError *error)
{
    eatBOM();

    char token;
    QCborValue value;

    if (!eatSpace()) {
        lastError = QJsonParseError::IllegalValue;
        goto error;
    }

    token = *json;
    if (token == Quote) {
        container = new QCborContainerPrivate;
        json++;
        if (!parseString())
            goto error;
        value = QCborContainerPrivate::makeValue(QCborValue::String, 0, container.take(),
                                                 QCborContainerPrivate::MoveContainer);
    } else {
        value = parseValue();
        if (value.isUndefined())
            goto error;
    }

    eatSpace();
    if (json < end) {
        lastError = QJsonParseError::GarbageAtEnd;
        goto error;
    }

    {
        if (error) {
            error->offset = 0;
            error->error = QJsonParseError::NoError;
        }

        return value;
    }

error:
    container.reset();
    if (error) {
        error->offset = json - head;
        error->error  = lastError;
    }
    return QCborValue();
}